

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O1

MIR_type_t get_result_type(MIR_type_t arg_type1,MIR_type_t arg_type2)

{
  MIR_type_t MVar1;
  
  if (arg_type1 != arg_type2) {
    if (arg_type1 == 0x14) {
      return arg_type2;
    }
    if (arg_type2 != 0x14) {
      MVar1 = MIR_T_UNDEF;
      if ((arg_type2 != MIR_T_UNDEF && arg_type1 != MIR_T_UNDEF) &&
         (MVar1 = MIR_T_I64,
         (arg_type2 & ~MIR_T_I16) != MIR_T_I32 && (arg_type1 & ~MIR_T_I16) != MIR_T_I32)) {
        MVar1 = (uint)(arg_type2 == MIR_T_LD) * 9 + MIR_T_D;
        if (arg_type1 == MIR_T_LD) {
          MVar1 = MIR_T_UNDEF;
        }
        if (arg_type1 == 0x15) {
          MVar1 = MIR_T_UNDEF;
        }
        if (arg_type2 == 0x15) {
          MVar1 = MIR_T_UNDEF;
        }
      }
      return MVar1;
    }
  }
  return arg_type1;
}

Assistant:

static MIR_type_t get_result_type (MIR_type_t arg_type1, MIR_type_t arg_type2) {
  if (arg_type1 == arg_type2) return arg_type1;
  if ((enum add_arg_class) arg_type1 == NO_CLASS) return arg_type2;
  if ((enum add_arg_class) arg_type2 == NO_CLASS) return arg_type1;

  if (arg_type1 == MIR_T_UNDEF || arg_type2 == MIR_T_UNDEF) return MIR_T_UNDEF;

  if (arg_type1 == MIR_T_I64 || arg_type1 == MIR_T_I32 || arg_type2 == MIR_T_I64
      || arg_type2 == MIR_T_I32)
    return MIR_T_I64;

  if (arg_type1 == MIR_T_LD || arg_type2 == MIR_T_LD
      || (enum add_arg_class) arg_type1 == X87UP_CLASS
      || (enum add_arg_class) arg_type2 == X87UP_CLASS)
    return MIR_T_UNDEF;

  return MIR_T_D;
}